

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Random.cpp
# Opt level: O1

void amrex::InitRandom(ULong cpu_seed,int nprocs,ULong gpu_seed)

{
  ulong *puVar1;
  ulong uVar2;
  ULong init_seed;
  size_t __i;
  long lVar3;
  
  ::(anonymous_namespace)::nthreads = 1;
  lVar3 = 1;
  std::
  vector<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::allocator<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
  ::resize((vector<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::allocator<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
            *)&::(anonymous_namespace)::generators,1);
  puVar1 = ::(anonymous_namespace)::generators;
  uVar2 = cpu_seed & 0xffffffff;
  *::(anonymous_namespace)::generators = uVar2;
  do {
    uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar3);
    puVar1[lVar3] = uVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  puVar1[0x270] = 0x270;
  return;
}

Assistant:

void
amrex::InitRandom (amrex::ULong cpu_seed, int nprocs, amrex::ULong gpu_seed)
{
    nthreads = OpenMP::get_max_threads();
    generators.resize(nthreads);

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
    {
        int tid = OpenMP::get_thread_num();
        amrex::ULong init_seed = cpu_seed + tid*nprocs;
        generators[tid].seed(init_seed);
    }

#ifdef AMREX_USE_GPU
    ResizeRandomSeed(gpu_seed);
#else
    amrex::ignore_unused(gpu_seed);
#endif
}